

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O0

void i2c_detect_devices(int bus)

{
  mraa_result_t mVar1;
  uint8_t local_1d;
  uint local_1c;
  uint8_t value;
  long lStack_18;
  int addr;
  mraa_i2c_context i2c;
  int bus_local;
  
  i2c._4_4_ = bus;
  lStack_18 = mraa_i2c_init(bus);
  if (lStack_18 != 0) {
    for (local_1c = 0; (int)local_1c < 0x80; local_1c = local_1c + 1) {
      if ((int)local_1c % 0x10 == 0) {
        printf("%02x: ",(ulong)local_1c);
      }
      mVar1 = i2c_get(i2c._4_4_,(uint8_t)local_1c,'\0',&local_1d);
      if (mVar1 == MRAA_SUCCESS) {
        printf("%02x ",(ulong)local_1c);
      }
      else {
        printf("-- ");
      }
      if ((int)(local_1c + 1) % 0x10 == 0) {
        printf("\n");
      }
    }
  }
  return;
}

Assistant:

void
i2c_detect_devices(int bus)
{
    mraa_i2c_context i2c = mraa_i2c_init(bus);
    if (i2c == NULL) {
        return;
    }
    int addr;
    for (addr = 0x0; addr < 0x80; ++addr) {
        uint8_t value;
        if ((addr) % 16 == 0)
            printf("%02x: ", addr);
        if (i2c_get(bus, addr, 0, &value) == MRAA_SUCCESS)
            printf("%02x ", addr);
        else
            printf("-- ");
        if ((addr + 1) % 16 == 0)
            printf("\n");
    }
}